

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O1

bool __thiscall
gss::innards::HomomorphismModel::_check_degree_compatibility
          (HomomorphismModel *this,int p,int t,uint graphs_to_consider,
          vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          *patterns_ndss,
          vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
          *targets_ndss,bool do_not_do_nds_yet)

{
  ulong *puVar1;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var2;
  pointer pvVar3;
  pointer poVar4;
  iterator __position;
  long lVar5;
  long lVar6;
  Proof *pPVar7;
  byte bVar8;
  undefined8 *puVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  pointer pvVar13;
  undefined8 uVar14;
  anon_union_128_2_84168a9f_for__data *paVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  int *piVar21;
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  *pvVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __i;
  undefined8 *puVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  vector<int,_std::allocator<int>_> n_t;
  vector<int,_std::allocator<int>_> n_p;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> t_nds;
  vector<int,_std::allocator<int>_> t_remaining;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> p_nds;
  SVOBitset np;
  SVOBitset nt;
  int local_290;
  vector<int,_std::allocator<int>_> local_268;
  vector<int,_std::allocator<int>_> local_248;
  long local_228;
  undefined8 *local_220;
  uint local_214;
  ulong local_210;
  undefined1 local_208 [16];
  long local_1f8;
  NamedVertex local_1e8;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *local_1c0;
  vector<int,_std::allocator<int>_> local_1b8;
  undefined1 local_198 [16];
  long local_188;
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  *local_180;
  long local_178;
  NamedVertex local_170;
  anon_union_128_2_84168a9f_for__data local_148;
  uint local_c8;
  anon_union_128_2_84168a9f_for__data local_b8;
  uint local_38;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  
  local_1c0 = patterns_ndss;
  bVar10 = degree_and_nds_are_preserved
                     (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->params);
  if (bVar10) {
    bVar10 = graphs_to_consider != 0;
    local_214 = graphs_to_consider;
    local_180 = targets_ndss;
    if (bVar10) {
      uVar23 = 0;
LAB_0012ede3:
      _Var2._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      lVar28 = (long)(int)uVar23 * 0x18;
      if (*(uint *)(*(long *)(*(long *)&((_Var2._M_head_impl)->patterns_degrees).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             + lVar28) + (long)p * 4) <=
          *(uint *)(*(long *)(*(long *)&((_Var2._M_head_impl)->targets_degrees).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             + lVar28) + (long)t * 4)) {
        bVar11 = degree_and_nds_are_exact
                           ((_Var2._M_head_impl)->params,this->pattern_size,this->target_size);
        if ((!bVar11) ||
           (_Var2._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl,
           *(int *)(*(long *)(*(long *)&((_Var2._M_head_impl)->targets_degrees).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             + lVar28) + (long)t * 4) ==
           *(int *)(*(long *)(*(long *)&((_Var2._M_head_impl)->patterns_degrees).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             + lVar28) + (long)p * 4))) goto LAB_0012ee56;
        goto LAB_0012f180;
      }
      if (*(long *)&((_Var2._M_head_impl)->proof).
                    super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> == 0)
      goto LAB_0012f180;
      local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      SVOBitset::SVOBitset
                ((SVOBitset *)&local_148,
                 (SVOBitset *)
                 ((ulong)(this->max_graphs * p + uVar23) * 0x88 +
                 *(long *)&((_Var2._M_head_impl)->pattern_graph_rows).
                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 ));
      if (this->pattern_size != 0) {
        uVar29 = 0;
        do {
          uVar14 = &local_148;
          if (0x10 < local_c8) {
            uVar14 = local_148.short_data[0];
          }
          uVar18 = uVar29 + 0x3f;
          if (-1 < (int)uVar29) {
            uVar18 = uVar29;
          }
          if ((*(ulong *)(uVar14 + (long)((int)uVar18 >> 6) * 8) >> ((ulong)uVar29 & 0x3f) & 1) != 0
             ) {
            local_b8.short_data[0]._0_4_ = uVar29;
            if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_248,
                         (iterator)
                         local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)local_b8.short_data);
            }
            else {
              *local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar29;
              local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 < this->pattern_size);
      }
      paVar15 = &local_b8;
      SVOBitset::SVOBitset
                ((SVOBitset *)paVar15,
                 (SVOBitset *)
                 ((ulong)(this->max_graphs * t + uVar23) * 0x88 +
                 *(long *)&(((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                            _M_head_impl)->target_graph_rows).
                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 ));
      uVar12 = (ulong)local_38;
      if (0x10 < uVar12) {
        paVar15 = (anon_union_128_2_84168a9f_for__data *)
                  CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_);
      }
      iVar16 = -1;
      if (uVar12 != 0) {
        lVar28 = 0;
        do {
          uVar19 = paVar15->short_data[0];
          if (uVar19 != 0) {
            iVar16 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              iVar16 = iVar16 + 1;
            }
            iVar16 = iVar16 - (int)lVar28;
            break;
          }
          lVar28 = lVar28 + -0x40;
          paVar15 = (anon_union_128_2_84168a9f_for__data *)((long)paVar15 + 8);
        } while (uVar12 * 0x40 + lVar28 != 0);
      }
      if (iVar16 != -1) {
        do {
          paVar15 = &local_b8;
          if (0x10 < local_38) {
            paVar15 = (anon_union_128_2_84168a9f_for__data *)
                      CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_);
          }
          bVar8 = (byte)iVar16 & 0x3f;
          iVar17 = iVar16 + 0x3f;
          if (-1 < iVar16) {
            iVar17 = iVar16;
          }
          paVar15->short_data[iVar17 >> 6] =
               paVar15->short_data[iVar17 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          local_1e8.first = iVar16;
          if (local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_268,
                       (iterator)
                       local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_1e8.first);
          }
          else {
            *local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = iVar16;
            local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          uVar12 = (ulong)local_38;
          paVar15 = &local_b8;
          if (0x10 < uVar12) {
            paVar15 = (anon_union_128_2_84168a9f_for__data *)
                      CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_);
          }
          iVar16 = -1;
          if (uVar12 != 0) {
            lVar28 = 0;
LAB_0012f056:
            uVar19 = paVar15->short_data[0];
            if (uVar19 == 0) goto code_r0x0012f05e;
            iVar16 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              iVar16 = iVar16 + 1;
            }
            iVar16 = iVar16 - (int)lVar28;
          }
LAB_0012f077:
        } while (iVar16 != -1);
      }
      pPVar7 = (((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
               ->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pattern_vertex_for_proof_abi_cxx11_(&local_1e8,this,p);
      target_vertex_for_proof_abi_cxx11_(&local_170,this,t);
      Proof::incompatible_by_degrees(pPVar7,uVar23,&local_1e8,&local_248,&local_170,&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170.second._M_dataplus._M_p != &local_170.second.field_2) {
        operator_delete(local_170.second._M_dataplus._M_p,
                        local_170.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.second._M_dataplus._M_p != &local_1e8.second.field_2) {
        operator_delete(local_1e8.second._M_dataplus._M_p,
                        local_1e8.second.field_2._M_allocated_capacity + 1);
      }
      if ((0x10 < local_38) &&
         ((void *)CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_) != (void *)0x0
         )) {
        operator_delete__((void *)CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_
                                          ));
      }
      if ((0x10 < local_c8) && ((void *)local_148.short_data[0] != (void *)0x0)) {
        operator_delete__(local_148.long_data);
      }
      if (local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
LAB_0012f180:
      if (bVar10) {
        return false;
      }
    }
LAB_0012f192:
    pvVar22 = local_180;
    uVar23 = local_214;
    if (!do_not_do_nds_yet &&
        *(char *)((long)((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->params + 0x8a) == '\0') {
      pvVar3 = (local_180->
               super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((local_180->
          super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish == pvVar3) {
        uVar19 = 0;
        uVar12 = 0;
      }
      else {
        uVar27 = (ulong)t;
        poVar4 = (pvVar3->
                 super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar19 = (long)(pvVar3->
                       super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)poVar4 >> 5;
        uVar12 = uVar27;
        if (uVar27 < uVar19) {
          local_228 = uVar27 * 0x20;
          if ((local_214 != 0) &&
             (*(bool *)((long)&poVar4[uVar27].
                               super__Optional_base<std::vector<int,_std::allocator<int>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::vector<int,_std::allocator<int>_>,_true,_false,_false>
                       + 0x18) == false)) {
            uVar12 = 0;
            do {
              local_148._0_16_ = (undefined1  [16])0x0;
              local_148.short_data[2] = 0;
              pvVar3 = (pvVar22->
                       super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar20 = ((long)(pvVar22->
                              super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                       -0x5555555555555555;
              uVar19 = uVar12;
              if ((uVar20 < uVar12 || uVar20 - uVar12 == 0) ||
                 (lVar28 = *(long *)&pvVar3[uVar12].
                                     super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data, uVar19 = uVar27,
                 (ulong)((long)*(pointer *)
                                ((long)&pvVar3[uVar12].
                                        super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar28 >> 5) <=
                 uVar27)) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar19);
              }
              std::optional<std::vector<int,std::allocator<int>>>::operator=
                        ((optional<std::vector<int,std::allocator<int>>> *)(lVar28 + local_228),
                         (vector<int,_std::allocator<int>_> *)&local_148);
              if ((void *)local_148.short_data[0] != (void *)0x0) {
                operator_delete(local_148.long_data,local_148.short_data[2] - local_148._0_8_);
              }
              iVar16 = (int)uVar12;
              SVOBitset::SVOBitset
                        ((SVOBitset *)&local_148,
                         (SVOBitset *)
                         ((ulong)(this->max_graphs * t + iVar16) * 0x88 +
                         *(long *)&(((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     .
                                     super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                    ._M_head_impl)->target_graph_rows).
                                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                         ));
              uVar19 = (ulong)local_c8;
              uVar14 = &local_148;
              if (0x10 < uVar19) {
                uVar14 = local_148.short_data[0];
              }
              iVar17 = -1;
              if (uVar19 != 0) {
                lVar28 = 0;
LAB_0012f2fb:
                uVar20 = *(ulong *)uVar14;
                if (uVar20 == 0) goto code_r0x0012f303;
                iVar17 = 0;
                for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                  iVar17 = iVar17 + 1;
                }
                iVar17 = iVar17 - (int)lVar28;
              }
LAB_0012f31c:
              if (iVar17 != -1) {
                do {
                  uVar14 = &local_148;
                  if (0x10 < local_c8) {
                    uVar14 = local_148.short_data[0];
                  }
                  bVar8 = (byte)iVar17 & 0x3f;
                  iVar25 = iVar17 + 0x3f;
                  if (-1 < iVar17) {
                    iVar25 = iVar17;
                  }
                  *(ulong *)(uVar14 + (long)(iVar25 >> 6) * 8) =
                       *(ulong *)(uVar14 + (long)(iVar25 >> 6) * 8) &
                       (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
                  pvVar3 = (pvVar22->
                           super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  uVar20 = ((long)(pvVar22->
                                  super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                           -0x5555555555555555;
                  uVar19 = uVar12;
                  if ((uVar20 < uVar12 || uVar20 - uVar12 == 0) ||
                     (lVar28 = *(long *)&pvVar3[uVar12].
                                         super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data, uVar19 = uVar27,
                     (ulong)((long)*(pointer *)
                                    ((long)&pvVar3[uVar12].
                                            super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) - lVar28 >> 5) <=
                     uVar27)) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar19);
                  }
                  local_b8.short_data[0]._0_4_ =
                       *(uint *)(*(long *)(*(long *)&(((this->_imp)._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->targets_degrees).
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          + (long)iVar16 * 0x18) + (long)iVar17 * 4);
                  __position._M_current = *(int **)(lVar28 + 8 + local_228);
                  if (__position._M_current == *(int **)(lVar28 + 0x10 + local_228)) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              ((vector<int,_std::allocator<int>_> *)(lVar28 + local_228),__position,
                               (int *)local_b8.short_data);
                  }
                  else {
                    *__position._M_current = local_b8.short_data[0]._0_4_;
                    (((vector<int,_std::allocator<int>_> *)(lVar28 + local_228))->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_finish = __position._M_current + 1;
                  }
                  uVar19 = (ulong)local_c8;
                  uVar14 = &local_148;
                  if (0x10 < uVar19) {
                    uVar14 = local_148.short_data[0];
                  }
                  iVar17 = -1;
                  if (uVar19 != 0) {
                    lVar28 = 0;
LAB_0012f413:
                    uVar20 = *(ulong *)uVar14;
                    if (uVar20 == 0) goto code_r0x0012f41b;
                    iVar17 = 0;
                    for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                      iVar17 = iVar17 + 1;
                    }
                    iVar17 = iVar17 - (int)lVar28;
                  }
LAB_0012f434:
                } while (iVar17 != -1);
              }
              pvVar3 = (pvVar22->
                       super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar20 = ((long)(pvVar22->
                              super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                       -0x5555555555555555;
              uVar19 = uVar12;
              if ((uVar20 < uVar12 || uVar20 - uVar12 == 0) ||
                 (lVar28 = *(long *)&pvVar3[uVar12].
                                     super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data, uVar19 = uVar27,
                 (ulong)((long)*(pointer *)
                                ((long)&pvVar3[uVar12].
                                        super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar28 >> 5) <=
                 uVar27)) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar19);
              }
              lVar5 = *(long *)(lVar28 + local_228);
              lVar28 = *(long *)(lVar28 + 8 + local_228);
              if (lVar5 != lVar28) {
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                          (lVar5,lVar28,(int)LZCOUNT(lVar28 - lVar5 >> 2) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                          (lVar5,lVar28);
              }
              if ((0x10 < local_c8) && ((void *)local_148.short_data[0] != (void *)0x0)) {
                operator_delete__(local_148.long_data);
              }
              uVar12 = (ulong)(iVar16 + 1U);
            } while (iVar16 + 1U != uVar23);
          }
          bVar10 = uVar23 == 0;
          if (bVar10) {
            return bVar10;
          }
          local_210 = (ulong)p;
          local_178 = local_210 * 3;
          uVar20 = 0;
          while( true ) {
            pvVar13 = (local_1c0->
                      super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar19 = ((long)(local_1c0->
                            super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
                     -0x5555555555555555;
            uVar12 = uVar20;
            if (uVar19 < uVar20 || uVar19 - uVar20 == 0) break;
            uVar24 = 0;
            uVar23 = 2;
            while( true ) {
              lVar28 = *(long *)&pvVar13[uVar20].
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data;
              uVar19 = ((long)*(pointer *)
                               ((long)&pvVar13[uVar20].
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar28 >> 3) *
                       -0x5555555555555555;
              uVar12 = local_210;
              if (uVar19 < local_210 || uVar19 - local_210 == 0) goto LAB_0012ffe3;
              lVar5 = *(long *)(lVar28 + local_178 * 8);
              uVar31 = *(long *)(lVar28 + 8 + local_178 * 8) - lVar5 >> 2;
              local_290 = (int)uVar20;
              if (uVar31 <= uVar24) goto LAB_0012ff60;
              pvVar3 = (pvVar22->
                       super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar19 = ((long)(pvVar22->
                              super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                       -0x5555555555555555;
              uVar12 = uVar20;
              if (uVar19 < uVar20 || uVar19 - uVar20 == 0) goto LAB_0012ffe3;
              lVar28 = *(long *)&pvVar3[uVar20].
                                 super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data;
              uVar19 = (long)*(pointer *)
                              ((long)&pvVar3[uVar20].
                                      super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) - lVar28 >> 5;
              uVar12 = uVar27;
              if (uVar19 <= uVar27) goto LAB_0012ffe3;
              uVar19 = *(long *)(lVar28 + 8 + local_228) - *(long *)(lVar28 + local_228) >> 2;
              uVar12 = uVar24;
              if (uVar19 <= uVar24) goto LAB_0012ffe3;
              _Var2._M_head_impl =
                   (this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl;
              uVar29 = (uint)uVar24;
              if (*(int *)(*(long *)(lVar28 + local_228) + uVar24 * 4) <
                  *(int *)(lVar5 + uVar24 * 4)) break;
              bVar11 = degree_and_nds_are_exact
                                 ((_Var2._M_head_impl)->params,this->pattern_size,this->target_size)
              ;
              if (bVar11) {
                pvVar3 = (pvVar22->
                         super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                uVar19 = ((long)(pvVar22->
                                super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                         -0x5555555555555555;
                uVar12 = uVar20;
                if (uVar19 < uVar20 || uVar19 - uVar20 == 0) goto LAB_0012ffe3;
                lVar28 = *(long *)&pvVar3[uVar20].
                                   super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data;
                uVar19 = (long)*(pointer *)
                                ((long)&pvVar3[uVar20].
                                        super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar28 >> 5;
                uVar12 = uVar27;
                if (uVar19 <= uVar27) goto LAB_0012ffe3;
                uVar19 = *(long *)(lVar28 + 8 + local_228) - *(long *)(lVar28 + local_228) >> 2;
                uVar12 = uVar24;
                if (uVar19 <= uVar24) goto LAB_0012ffe3;
                pvVar13 = (local_1c0->
                          super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                uVar19 = ((long)(local_1c0->
                                super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
                         -0x5555555555555555;
                uVar12 = uVar20;
                if (uVar19 < uVar20 || uVar19 - uVar20 == 0) goto LAB_0012ffe3;
                lVar5 = *(long *)&pvVar13[uVar20].
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data;
                uVar19 = ((long)*(pointer *)
                                 ((long)&pvVar13[uVar20].
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data + 8) - lVar5 >> 3) *
                         -0x5555555555555555;
                uVar12 = local_210;
                if (uVar19 < local_210 || uVar19 - local_210 == 0) goto LAB_0012ffe3;
                lVar6 = *(long *)(lVar5 + local_178 * 8);
                uVar19 = *(long *)(lVar5 + 8 + local_178 * 8) - lVar6 >> 2;
                uVar12 = uVar24;
                if (uVar19 <= uVar24) goto LAB_0012ffe3;
                if (*(int *)(*(long *)(lVar28 + local_228) + uVar24 * 4) !=
                    *(int *)(lVar6 + uVar24 * 4)) goto LAB_0012ff5b;
              }
              uVar24 = (ulong)(uVar29 + 1);
              pvVar13 = (local_1c0->
                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar19 = ((long)(local_1c0->
                              super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
                       -0x5555555555555555;
              uVar23 = uVar23 + 1;
              uVar12 = uVar20;
              if (uVar19 < uVar20 || uVar19 - uVar20 == 0) goto LAB_0012ffe3;
            }
            if (*(long *)&((_Var2._M_head_impl)->proof).
                          super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0)
            {
              local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (int *)0x0;
              local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (int *)0x0;
              local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (int *)0x0;
              local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_188 = 0;
              local_198 = (undefined1  [16])0x0;
              local_1f8 = 0;
              local_208 = (undefined1  [16])0x0;
              SVOBitset::SVOBitset
                        ((SVOBitset *)&local_148,
                         (SVOBitset *)
                         ((ulong)(this->max_graphs * p + local_290) * 0x88 +
                         *(long *)&((_Var2._M_head_impl)->pattern_graph_rows).
                                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                         ));
              uVar12 = (ulong)local_c8;
              uVar14 = &local_148;
              if (0x10 < uVar12) {
                uVar14 = local_148.short_data[0];
              }
              uVar18 = 0xffffffff;
              if (uVar12 != 0) {
                lVar28 = 0;
                do {
                  uVar19 = *(ulong *)uVar14;
                  if (uVar19 != 0) goto LAB_0012f9a9;
                  lVar28 = lVar28 + -0x40;
                  uVar14 = uVar14 + 8;
                } while (uVar12 * 0x40 + lVar28 != 0);
              }
              goto LAB_0012f83b;
            }
LAB_0012ff5b:
            if (uVar24 < uVar31) {
              return bVar10;
            }
LAB_0012ff60:
            uVar23 = local_290 + 1;
            uVar20 = (ulong)uVar23;
            bVar10 = local_214 <= uVar23;
            if (uVar23 == local_214) {
              return bVar10;
            }
          }
        }
      }
LAB_0012ffe3:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12,
                 uVar19);
    }
  }
  return true;
LAB_0012ee56:
  uVar23 = uVar23 + 1;
  bVar10 = uVar23 < graphs_to_consider;
  if (uVar23 == graphs_to_consider) goto LAB_0012f192;
  goto LAB_0012ede3;
code_r0x0012f05e:
  lVar28 = lVar28 + -0x40;
  paVar15 = (anon_union_128_2_84168a9f_for__data *)(paVar15->short_data + 1);
  if (uVar12 * 0x40 + lVar28 == 0) goto LAB_0012f077;
  goto LAB_0012f056;
code_r0x0012f303:
  lVar28 = lVar28 + -0x40;
  uVar14 = uVar14 + 8;
  if (uVar19 * 0x40 + lVar28 == 0) goto LAB_0012f31c;
  goto LAB_0012f2fb;
code_r0x0012f41b:
  lVar28 = lVar28 + -0x40;
  uVar14 = uVar14 + 8;
  if (uVar19 * 0x40 + lVar28 == 0) goto LAB_0012f434;
  goto LAB_0012f413;
LAB_0012f83b:
  while( true ) {
    local_b8.short_data[0]._0_4_ = uVar18;
    if (uVar18 == 0xffffffff) break;
    uVar14 = &local_148;
    if (0x10 < local_c8) {
      uVar14 = local_148.short_data[0];
    }
    bVar8 = (byte)uVar18 & 0x3f;
    uVar26 = uVar18 + 0x3f;
    if (-1 < (int)uVar18) {
      uVar26 = uVar18;
    }
    *(ulong *)(uVar14 + (long)((int)uVar26 >> 6) * 8) =
         *(ulong *)(uVar14 + (long)((int)uVar26 >> 6) * 8) &
         (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
    lVar28 = *(long *)&(((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->pattern_graph_rows).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
    ;
    lVar5 = (ulong)(uVar18 * this->max_graphs + local_290) * 0x88;
    uVar12 = (ulong)*(uint *)(lVar28 + 0x80 + lVar5);
    if (uVar12 < 0x11) {
      lVar28 = lVar28 + lVar5;
    }
    else {
      lVar28 = *(long *)(lVar28 + lVar5);
    }
    if (uVar12 == 0) {
      local_1e8.first = 0;
    }
    else {
      auVar37 = vpbroadcastq_avx512f();
      uVar19 = 0;
      auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar39 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar41 = auVar39;
        auVar39 = vpbroadcastq_avx512f();
        auVar39 = vporq_avx512f(auVar39,auVar38);
        uVar20 = vpcmpuq_avx512f(auVar39,auVar37,2);
        auVar39 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar28 + uVar19 * 8));
        auVar40._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar39._8_8_;
        auVar40._0_8_ = (ulong)((byte)uVar20 & 1) * auVar39._0_8_;
        auVar40._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar39._16_8_;
        auVar40._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar39._24_8_;
        auVar40._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * auVar39._32_8_;
        auVar40._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * auVar39._40_8_;
        auVar40._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * auVar39._48_8_;
        auVar40._56_8_ = (uVar20 >> 7) * auVar39._56_8_;
        auVar39 = vpopcntq_avx512_vpopcntdq(auVar40);
        auVar34 = vpmovqd_avx512f(auVar39);
        auVar34 = vpaddd_avx2(auVar41._0_32_,auVar34);
        uVar19 = uVar19 + 8;
        auVar39 = ZEXT3264(auVar34);
      } while ((uVar12 + 7 & 0x1fffffff8) != uVar19);
      auVar34 = vmovdqa32_avx512vl(auVar34);
      bVar11 = (bool)((byte)uVar20 & 1);
      auVar32._0_4_ = (uint)bVar11 * auVar34._0_4_ | (uint)!bVar11 * auVar41._0_4_;
      bVar11 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar32._4_4_ = (uint)bVar11 * auVar34._4_4_ | (uint)!bVar11 * auVar41._4_4_;
      bVar11 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar32._8_4_ = (uint)bVar11 * auVar34._8_4_ | (uint)!bVar11 * auVar41._8_4_;
      bVar11 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar32._12_4_ = (uint)bVar11 * auVar34._12_4_ | (uint)!bVar11 * auVar41._12_4_;
      bVar11 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar35._16_4_ = (uint)bVar11 * auVar34._16_4_ | (uint)!bVar11 * auVar41._16_4_;
      auVar35._0_16_ = auVar32;
      bVar11 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar35._20_4_ = (uint)bVar11 * auVar34._20_4_ | (uint)!bVar11 * auVar41._20_4_;
      bVar11 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar35._24_4_ = (uint)bVar11 * auVar34._24_4_ | (uint)!bVar11 * auVar41._24_4_;
      bVar11 = SUB81(uVar20 >> 7,0);
      auVar35._28_4_ = (uint)bVar11 * auVar34._28_4_ | (uint)!bVar11 * auVar41._28_4_;
      auVar33 = vphaddd_avx(auVar35._16_16_,auVar32);
      auVar33 = vphaddd_avx(auVar33,auVar33);
      auVar33 = vphaddd_avx(auVar33,auVar33);
      local_1e8.first = auVar33._0_4_;
    }
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int&,unsigned_int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_198,
               (uint *)local_b8.short_data,(uint *)&local_1e8);
    uVar12 = (ulong)local_c8;
    uVar14 = &local_148;
    if (0x10 < uVar12) {
      uVar14 = local_148.short_data[0];
    }
    uVar18 = 0xffffffff;
    if (uVar12 != 0) {
      lVar28 = 0;
      do {
        uVar19 = *(ulong *)uVar14;
        if (uVar19 != 0) goto LAB_0012f9a9;
        lVar28 = lVar28 + -0x40;
        uVar14 = uVar14 + 8;
      } while (uVar12 * 0x40 + lVar28 != 0);
    }
  }
  paVar15 = &local_b8;
  SVOBitset::SVOBitset
            ((SVOBitset *)paVar15,
             (SVOBitset *)
             ((ulong)(this->max_graphs * t + local_290) * 0x88 +
             *(long *)&(((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->target_graph_rows).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
             ));
  uVar12 = (ulong)local_38;
  if (0x10 < uVar12) {
    paVar15 = (anon_union_128_2_84168a9f_for__data *)
              CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_);
  }
  local_1e8.first = -1;
  if (uVar12 != 0) {
    lVar28 = 0;
    do {
      uVar19 = paVar15->short_data[0];
      if (uVar19 != 0) goto LAB_0012fbaa;
      lVar28 = lVar28 + -0x40;
      paVar15 = (anon_union_128_2_84168a9f_for__data *)((long)paVar15 + 8);
    } while (uVar12 * 0x40 + lVar28 != 0);
  }
LAB_0012fa37:
  while (paVar15 = &local_b8, local_1e8.first != -1) {
    if (0x10 < local_38) {
      paVar15 = (anon_union_128_2_84168a9f_for__data *)
                CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_);
    }
    bVar8 = (byte)local_1e8.first & 0x3f;
    iVar16 = local_1e8.first + 0x3f;
    if (-1 < local_1e8.first) {
      iVar16 = local_1e8.first;
    }
    puVar1 = (ulong *)((long)paVar15 + (long)(iVar16 >> 6) * 8);
    *puVar1 = *puVar1 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
    lVar28 = *(long *)&(((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->target_graph_rows).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
    ;
    lVar5 = (ulong)(local_1e8.first * this->max_graphs + local_290) * 0x88;
    uVar12 = (ulong)*(uint *)(lVar28 + 0x80 + lVar5);
    if (uVar12 < 0x11) {
      lVar28 = lVar28 + lVar5;
    }
    else {
      lVar28 = *(long *)(lVar28 + lVar5);
    }
    if (uVar12 == 0) {
      local_170.first = 0;
    }
    else {
      auVar37 = vpbroadcastq_avx512f();
      uVar19 = 0;
      auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar39 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar41 = auVar39;
        auVar39 = vpbroadcastq_avx512f();
        auVar39 = vporq_avx512f(auVar39,auVar38);
        uVar20 = vpcmpuq_avx512f(auVar39,auVar37,2);
        auVar40 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar28 + uVar19 * 8));
        auVar39._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar40._8_8_;
        auVar39._0_8_ = (ulong)((byte)uVar20 & 1) * auVar40._0_8_;
        auVar39._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar40._16_8_;
        auVar39._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar40._24_8_;
        auVar39._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * auVar40._32_8_;
        auVar39._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * auVar40._40_8_;
        auVar39._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * auVar40._48_8_;
        auVar39._56_8_ = (uVar20 >> 7) * auVar40._56_8_;
        auVar39 = vpopcntq_avx512_vpopcntdq(auVar39);
        auVar34 = vpmovqd_avx512f(auVar39);
        auVar34 = vpaddd_avx2(auVar41._0_32_,auVar34);
        uVar19 = uVar19 + 8;
        auVar39 = ZEXT3264(auVar34);
      } while ((uVar12 + 7 & 0x1fffffff8) != uVar19);
      auVar34 = vmovdqa32_avx512vl(auVar34);
      bVar11 = (bool)((byte)uVar20 & 1);
      auVar33._0_4_ = (uint)bVar11 * auVar34._0_4_ | (uint)!bVar11 * auVar41._0_4_;
      bVar11 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar33._4_4_ = (uint)bVar11 * auVar34._4_4_ | (uint)!bVar11 * auVar41._4_4_;
      bVar11 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar33._8_4_ = (uint)bVar11 * auVar34._8_4_ | (uint)!bVar11 * auVar41._8_4_;
      bVar11 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar33._12_4_ = (uint)bVar11 * auVar34._12_4_ | (uint)!bVar11 * auVar41._12_4_;
      bVar11 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar36._16_4_ = (uint)bVar11 * auVar34._16_4_ | (uint)!bVar11 * auVar41._16_4_;
      auVar36._0_16_ = auVar33;
      bVar11 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar36._20_4_ = (uint)bVar11 * auVar34._20_4_ | (uint)!bVar11 * auVar41._20_4_;
      bVar11 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar36._24_4_ = (uint)bVar11 * auVar34._24_4_ | (uint)!bVar11 * auVar41._24_4_;
      bVar11 = SUB81(uVar20 >> 7,0);
      auVar36._28_4_ = (uint)bVar11 * auVar34._28_4_ | (uint)!bVar11 * auVar41._28_4_;
      auVar33 = vphaddd_avx(auVar36._16_16_,auVar33);
      auVar33 = vphaddd_avx(auVar33,auVar33);
      auVar33 = vphaddd_avx(auVar33,auVar33);
      local_170.first = auVar33._0_4_;
    }
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int&,unsigned_int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_208,
               (uint *)&local_1e8,(uint *)&local_170);
    uVar12 = (ulong)local_38;
    paVar15 = &local_b8;
    if (0x10 < uVar12) {
      paVar15 = (anon_union_128_2_84168a9f_for__data *)
                CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_);
    }
    local_1e8.first = -1;
    if (uVar12 != 0) {
      lVar28 = 0;
      do {
        uVar19 = paVar15->short_data[0];
        if (uVar19 != 0) goto LAB_0012fbaa;
        lVar28 = lVar28 + -0x40;
        paVar15 = (anon_union_128_2_84168a9f_for__data *)(paVar15->short_data + 1);
      } while (uVar12 * 0x40 + lVar28 != 0);
    }
  }
  uVar14 = local_198._0_8_;
  if (local_198._0_8_ != local_198._8_8_) {
    lVar28 = local_198._8_8_ - local_198._0_8_;
    local_220 = (undefined8 *)local_198._8_8_;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__0>>
              (local_198._0_8_,local_198._8_8_,(int)LZCOUNT(lVar28 >> 3) * 2 ^ 0x7e);
    if (lVar28 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__0>>
                (uVar14,local_220);
    }
    else {
      puVar30 = (undefined8 *)(uVar14 + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__0>>
                (uVar14,puVar30);
      for (; puVar30 != local_220; puVar30 = puVar30 + 1) {
        uVar14 = *puVar30;
        iVar17 = (int)((ulong)uVar14 >> 0x20);
        iVar16 = *(int *)((long)puVar30 + -4);
        puVar9 = puVar30;
        while (iVar16 < iVar17) {
          *puVar9 = puVar9[-1];
          iVar16 = *(int *)((long)puVar9 + -0xc);
          puVar9 = puVar9 + -1;
        }
        *(int *)puVar9 = (int)uVar14;
        *(int *)((long)puVar9 + 4) = iVar17;
      }
    }
  }
  uVar14 = local_208._0_8_;
  if (local_208._0_8_ != local_208._8_8_) {
    lVar28 = local_208._8_8_ - local_208._0_8_;
    local_220 = (undefined8 *)local_208._8_8_;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__1>>
              (local_208._0_8_,local_208._8_8_,(int)LZCOUNT(lVar28 >> 3) * 2 ^ 0x7e);
    if (lVar28 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__1>>
                (uVar14,local_220);
    }
    else {
      puVar30 = (undefined8 *)(uVar14 + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__1>>
                (uVar14,puVar30);
      for (; puVar30 != local_220; puVar30 = puVar30 + 1) {
        uVar14 = *puVar30;
        iVar17 = (int)((ulong)uVar14 >> 0x20);
        iVar16 = *(int *)((long)puVar30 + -4);
        puVar9 = puVar30;
        while (iVar16 < iVar17) {
          *puVar9 = puVar9[-1];
          iVar16 = *(int *)((long)puVar9 + -0xc);
          puVar9 = puVar9 + -1;
        }
        *(int *)puVar9 = (int)uVar14;
        *(int *)((long)puVar9 + 4) = iVar17;
      }
    }
  }
  uVar18 = 0;
  do {
    piVar21 = (int *)(local_198._0_8_ + (ulong)uVar18 * 8);
    if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_248,
                 (iterator)
                 local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,piVar21);
    }
    else {
      *local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = *piVar21;
      local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    piVar21 = (int *)((ulong)uVar18 * 8 + local_208._0_8_);
    if (local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_268,
                 (iterator)
                 local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,piVar21);
    }
    else {
      *local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = *piVar21;
      local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    pvVar22 = local_180;
    uVar18 = uVar18 + 1;
  } while (uVar18 <= uVar29);
  uVar12 = (ulong)(uVar29 + 1);
  if (uVar12 < (ulong)((long)(local_208._8_8_ - local_208._0_8_) >> 3)) {
    do {
      piVar21 = (int *)(local_208._0_8_ + uVar12 * 8);
      if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1b8,
                   (iterator)
                   local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,piVar21);
      }
      else {
        *local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *piVar21;
        local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar12 = (ulong)uVar23;
      uVar23 = uVar23 + 1;
    } while (uVar12 < (ulong)((long)(local_208._8_8_ - local_208._0_8_) >> 3));
  }
  pPVar7 = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
           proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pattern_vertex_for_proof_abi_cxx11_(&local_1e8,this,p);
  target_vertex_for_proof_abi_cxx11_(&local_170,this,t);
  Proof::incompatible_by_nds
            (pPVar7,local_290,&local_1e8,&local_170,&local_248,&local_268,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.second._M_dataplus._M_p != &local_170.second.field_2) {
    operator_delete(local_170.second._M_dataplus._M_p,
                    local_170.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.second._M_dataplus._M_p != &local_1e8.second.field_2) {
    operator_delete(local_1e8.second._M_dataplus._M_p,
                    local_1e8.second.field_2._M_allocated_capacity + 1);
  }
  if ((0x10 < local_38) &&
     ((void *)CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_));
  }
  if ((0x10 < local_c8) && ((void *)local_148.short_data[0] != (void *)0x0)) {
    operator_delete__(local_148.long_data);
  }
  if ((void *)local_208._0_8_ != (void *)0x0) {
    operator_delete((void *)local_208._0_8_,local_1f8 - local_208._0_8_);
  }
  if ((void *)local_198._0_8_ != (void *)0x0) {
    operator_delete((void *)local_198._0_8_,local_188 - local_198._0_8_);
  }
  if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  goto LAB_0012ff5b;
LAB_0012fbaa:
  local_1e8.first = 0;
  for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
    local_1e8.first = local_1e8.first + 1;
  }
  local_1e8.first = local_1e8.first - (int)lVar28;
  goto LAB_0012fa37;
LAB_0012f9a9:
  iVar16 = 0;
  for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
    iVar16 = iVar16 + 1;
  }
  uVar18 = iVar16 - (int)lVar28;
  goto LAB_0012f83b;
}

Assistant:

auto HomomorphismModel::_check_degree_compatibility(
    int p,
    int t,
    unsigned graphs_to_consider,
    vector<vector<vector<int>>> & patterns_ndss,
    vector<vector<optional<vector<int>>>> & targets_ndss,
    bool do_not_do_nds_yet) const -> bool
{
    if (! degree_and_nds_are_preserved(_imp->params))
        return true;

    for (unsigned g = 0; g < graphs_to_consider; ++g) {
        if (target_degree(g, t) < pattern_degree(g, p)) {
            // not ok, degrees differ
            if (_imp->proof) {
                // get the actual neighbours of p and t, in their original terms
                vector<int> n_p, n_t;

                auto np = pattern_graph_row(g, p);
                for (unsigned j = 0; j < pattern_size; ++j)
                    if (np.test(j))
                        n_p.push_back(j);

                auto nt = target_graph_row(g, t);
                for (auto j = nt.find_first(); j != decltype(nt)::npos; j = nt.find_first()) {
                    nt.reset(j);
                    n_t.push_back(j);
                }

                _imp->proof->incompatible_by_degrees(g, pattern_vertex_for_proof(p), n_p,
                    target_vertex_for_proof(t), n_t);
            }
            return false;
        }
        else if (degree_and_nds_are_exact(_imp->params, pattern_size, target_size) && target_degree(g, t) != pattern_degree(g, p)) {
            // not ok, degrees must be exactly the same
            return false;
        }
    }
    if (_imp->params.no_nds || do_not_do_nds_yet)
        return true;

    // full compare of neighbourhood degree sequences
    if (! targets_ndss.at(0).at(t)) {
        for (unsigned g = 0; g < graphs_to_consider; ++g) {
            targets_ndss.at(g).at(t) = vector<int>{};
            auto ni = target_graph_row(g, t);
            for (auto j = ni.find_first(); j != decltype(ni)::npos; j = ni.find_first()) {
                ni.reset(j);
                targets_ndss.at(g).at(t)->push_back(target_degree(g, j));
            }
            sort(targets_ndss.at(g).at(t)->begin(), targets_ndss.at(g).at(t)->end(), greater<int>());
        }
    }

    for (unsigned g = 0; g < graphs_to_consider; ++g) {
        for (unsigned x = 0; x < patterns_ndss.at(g).at(p).size(); ++x) {
            if (targets_ndss.at(g).at(t)->at(x) < patterns_ndss.at(g).at(p).at(x)) {
                if (_imp->proof) {
                    vector<int> p_subsequence, t_subsequence, t_remaining;

                    // need to know the NDS together with the actual vertices
                    vector<pair<int, int>> p_nds, t_nds;

                    auto np = pattern_graph_row(g, p);
                    for (auto w = np.find_first(); w != decltype(np)::npos; w = np.find_first()) {
                        np.reset(w);
                        p_nds.emplace_back(w, pattern_graph_row(g, w).count());
                    }

                    auto nt = target_graph_row(g, t);
                    for (auto w = nt.find_first(); w != decltype(nt)::npos; w = nt.find_first()) {
                        nt.reset(w);
                        t_nds.emplace_back(w, target_graph_row(g, w).count());
                    }

                    sort(p_nds.begin(), p_nds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });
                    sort(t_nds.begin(), t_nds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });

                    for (unsigned y = 0; y <= x; ++y) {
                        p_subsequence.push_back(p_nds[y].first);
                        t_subsequence.push_back(t_nds[y].first);
                    }
                    for (unsigned y = x + 1; y < t_nds.size(); ++y)
                        t_remaining.push_back(t_nds[y].first);

                    _imp->proof->incompatible_by_nds(g, pattern_vertex_for_proof(p),
                        target_vertex_for_proof(t), p_subsequence, t_subsequence, t_remaining);
                }
                return false;
            }
            else if (degree_and_nds_are_exact(_imp->params, pattern_size, target_size) && targets_ndss.at(g).at(t)->at(x) != patterns_ndss.at(g).at(p).at(x))
                return false;
        }
    }

    return true;
}